

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-get-attr.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  BigAttr *pBVar2;
  char *pcVar3;
  FILE *__stream;
  char *__format;
  char **unaff_R13;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auStack_98 [8];
  BigBlock bb;
  ulong local_40;
  size_t nattr;
  BigFile bf;
  
  nattr = 0;
  bb.Nfile = 0;
  bb._60_4_ = 0;
  bb.attrset = (BigAttrSet *)0x0;
  bb.foffset = (size_t *)0x0;
  bb.fchecksum = (uint *)0x0;
  bb.size = 0;
  bb.fsize = (size_t *)0x0;
  bb.nmemb = 0;
  bb._12_4_ = 0;
  bb.basename = (char *)0x0;
  auStack_98[0] = '\0';
  auStack_98[1] = '\0';
  auStack_98[2] = '\0';
  auStack_98[3] = '\0';
  auStack_98[4] = '\0';
  auStack_98[5] = '\0';
  auStack_98[6] = '\0';
  auStack_98[7] = '\0';
  bb.dtype[0] = '\0';
  bb.dtype[1] = '\0';
  bb.dtype[2] = '\0';
  bb.dtype[3] = '\0';
  bb.dtype[4] = '\0';
  bb.dtype[5] = '\0';
  bb.dtype[6] = '\0';
  bb.dtype[7] = '\0';
  while( true ) {
    iVar1 = getopt(argc,argv,"l");
    if (iVar1 != 0x6c) break;
    longfmt = 1;
  }
  if ((iVar1 == -1) && (1 < argc - _optind)) {
    unaff_R13 = argv + _optind;
    iVar1 = big_file_open((BigFile *)&nattr,*unaff_R13);
    if (iVar1 == 0) {
      iVar1 = big_file_open_block((BigFile *)&nattr,(BigBlock *)auStack_98,unaff_R13[1]);
      __stream = _stderr;
      if (iVar1 == 0) {
        if (argc - _optind == 2) {
          pBVar2 = big_block_list_attrs((BigBlock *)auStack_98,&local_40);
          for (uVar5 = 0; uVar5 < local_40; uVar5 = uVar5 + 1) {
            print_attr(pBVar2,0);
            pBVar2 = pBVar2 + 1;
          }
        }
        for (lVar6 = 3; lVar6 <= (long)argc - (long)_optind; lVar6 = lVar6 + 1) {
          pBVar2 = big_block_lookup_attr((BigBlock *)auStack_98,unaff_R13[lVar6 + -1]);
          if (pBVar2 == (BigAttr *)0x0) {
            printf("%s, not attr:\n",unaff_R13[lVar6 + -1]);
          }
          else {
            print_attr(pBVar2,(uint)(argc - _optind == 3));
          }
        }
        big_block_close((BigBlock *)auStack_98);
        big_file_close((BigFile *)&nattr);
        return 0;
      }
      pcVar4 = unaff_R13[1];
      pcVar3 = big_file_get_error_message();
      __format = "failed to open block: %s %s\n";
      goto LAB_00102586;
    }
  }
  else {
    usage();
  }
  __stream = _stderr;
  pcVar4 = *unaff_R13;
  pcVar3 = big_file_get_error_message();
  __format = "failed to open file : %s %s\n";
LAB_00102586:
  fprintf(__stream,__format,pcVar4,pcVar3);
  exit(1);
}

Assistant:

int main(int argc, char * argv[]) {
    BigFile bf = {0};
    BigBlock bb = {0};

    int opt;
    while(-1 != (opt = getopt(argc, argv, "l"))) {
        switch(opt) {
            case 'l':
                longfmt = 1;
                break;
            default:
                usage();
        }
    }
    argv += optind - 1;
    if(argc - optind < 2) {
        usage();
    }

    if(0 != big_file_open(&bf, argv[1])) {
        fprintf(stderr, "failed to open file : %s %s\n", argv[1], big_file_get_error_message());
        exit(1);
    }
    if(0 != big_file_open_block(&bf, &bb, argv[2])) {
        fprintf(stderr, "failed to open block: %s %s\n", argv[2], big_file_get_error_message());
        exit(1);
    }
    int i; 
    if(argc - optind == 2) {
        size_t nattr;
        BigAttr * attrs = big_block_list_attrs(&bb, &nattr);
        for(i = 0; i < nattr; i ++) {
            BigAttr * attr = &attrs[i];
            print_attr(attr, 0);
        }
    }
    for(i = 3; i < argc - optind + 1; i ++) {
        BigAttr * attr = big_block_lookup_attr(&bb, argv[i]);
        if(attr) {
            print_attr(attr, argc - optind == 3);
        } else {
            printf("%s, not attr:\n", argv[i]);
        }
    }
    big_block_close(&bb);
    big_file_close(&bf);
    return 0;
}